

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::internal::ReturnAction<std::error_code>::Impl<std::error_code,_std::error_code_()>::Impl
          (Impl<std::error_code,_std::error_code_()> *this,shared_ptr<std::error_code> *value)

{
  error_category *peVar1;
  undefined4 uVar2;
  element_type *peVar3;
  error_category *extraout_RDX;
  error_code eVar4;
  shared_ptr<std::error_code> *value_local;
  Impl<std::error_code,_std::error_code_()> *this_local;
  
  ActionInterface<std::error_code_()>::ActionInterface
            (&this->super_ActionInterface<std::error_code_()>);
  (this->super_ActionInterface<std::error_code_()>)._vptr_ActionInterface =
       (_func_int **)&PTR__Impl_00258368;
  peVar3 = std::__shared_ptr_access<std::error_code,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<std::error_code,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)value);
  uVar2 = *(undefined4 *)&peVar3->field_0x4;
  peVar1 = peVar3->_M_cat;
  (this->value_before_cast_)._M_value = peVar3->_M_value;
  *(undefined4 *)&(this->value_before_cast_).field_0x4 = uVar2;
  (this->value_before_cast_)._M_cat = peVar1;
  eVar4._M_cat = extraout_RDX;
  eVar4._0_8_ = (this->value_before_cast_)._M_cat;
  eVar4 = ImplicitCast_<std::error_code>
                    ((internal *)(*(ulong *)&this->value_before_cast_ & 0xffffffff),eVar4);
  (this->value_)._M_value = eVar4._M_value;
  (this->value_)._M_cat = eVar4._M_cat;
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}